

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall ON_SubDMesh::FaceFragment(ON_SubDMesh *this,ON_SubDFace *face)

{
  ON_SubDMeshFragment *local_28;
  ON_SubDMeshFragment *fragment;
  ON_SubDFace *face_local;
  ON_SubDMesh *this_local;
  
  if (face != (ON_SubDFace *)0x0) {
    for (local_28 = FirstFragment(this); local_28 != (ON_SubDMeshFragment *)0x0;
        local_28 = local_28->m_next_fragment) {
      if (face == local_28->m_face) {
        return local_28;
      }
    }
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMesh::FaceFragment(
  const class ON_SubDFace* face
) const
{
  if (nullptr == face)
    return nullptr;
  for (const ON_SubDMeshFragment* fragment = FirstFragment(); nullptr != fragment; fragment = fragment->m_next_fragment)
  {
    if (face == fragment->m_face)
      return fragment;
  }
  return nullptr;
}